

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkmaze.c
# Opt level: O0

void place_lregion(level *lev,xchar lx,xchar ly,xchar hx,xchar hy,xchar nlx,xchar nly,xchar nhx,
                  xchar nhy,xchar rtype,d_level *dest_lvl)

{
  boolean bVar1;
  int iVar2;
  int iVar3;
  branch *br;
  bool local_41;
  char local_27;
  char local_26;
  int local_24;
  xchar y;
  xchar x;
  boolean oneshot;
  int trycnt;
  xchar nlx_local;
  xchar hy_local;
  xchar hx_local;
  xchar ly_local;
  xchar lx_local;
  level *lev_local;
  
  trycnt._0_1_ = hy;
  trycnt._1_1_ = hx;
  trycnt._2_1_ = ly;
  trycnt._3_1_ = lx;
  if (lx == '\0') {
    if ((rtype == '\x03') && (lev->nroom != 0)) {
      br = Is_branchlev(&lev->z);
      place_branch(lev,br,'\0','\0');
      return;
    }
    trycnt._3_1_ = '\x01';
    trycnt._1_1_ = 'O';
    trycnt._2_1_ = '\x01';
    trycnt._0_1_ = '\x14';
  }
  local_41 = trycnt._3_1_ == trycnt._1_1_ && trycnt._2_1_ == (xchar)trycnt;
  for (local_24 = 0; local_24 < 200; local_24 = local_24 + 1) {
    iVar2 = rn2(((int)trycnt._1_1_ - (int)trycnt._3_1_) + 1);
    iVar3 = rn2(((int)(xchar)trycnt - (int)trycnt._2_1_) + 1);
    bVar1 = put_lregion_here(lev,(char)iVar2 + trycnt._3_1_,(char)iVar3 + trycnt._2_1_,nlx,nly,nhx,
                             nhy,rtype,local_41,dest_lvl);
    if (bVar1 != '\0') {
      return;
    }
  }
  local_26 = trycnt._3_1_;
  do {
    if (trycnt._1_1_ < local_26) {
      impossible("Couldn\'t place lregion type %d!",(ulong)(uint)(int)rtype);
      return;
    }
    for (local_27 = trycnt._2_1_; local_27 <= (xchar)trycnt; local_27 = local_27 + '\x01') {
      bVar1 = put_lregion_here(lev,local_26,local_27,nlx,nly,nhx,nhy,rtype,'\x01',dest_lvl);
      if (bVar1 != '\0') {
        return;
      }
    }
    local_26 = local_26 + '\x01';
  } while( true );
}

Assistant:

void place_lregion(struct level *lev, xchar lx, xchar ly, xchar hx, xchar hy,
		   xchar nlx, xchar nly, xchar nhx, xchar nhy,
		   xchar rtype, d_level *dest_lvl)
{
    int trycnt;
    boolean oneshot;
    xchar x, y;

    if (!lx) { /* default to whole level */
	/*
	 * if there are rooms and this a branch, let place_branch choose
	 * the branch location (to avoid putting branches in corridors).
	 */
	if (rtype == LR_BRANCH && lev->nroom) {
	    place_branch(lev, Is_branchlev(&lev->z), 0, 0);
	    return;
	}

	lx = 1; hx = COLNO-1;
	ly = 1; hy = ROWNO-1;
    }

    /* first a probabilistic approach */
    oneshot = (lx == hx && ly == hy);
    for (trycnt = 0; trycnt < 200; trycnt++) {
	x = rn1((hx - lx) + 1, lx);
	y = rn1((hy - ly) + 1, ly);
	if (put_lregion_here(lev, x,y,nlx,nly,nhx,nhy,rtype,oneshot,dest_lvl))
	    return;
    }

    /* then a deterministic one */
    oneshot = TRUE;
    for (x = lx; x <= hx; x++)
	for (y = ly; y <= hy; y++)
	    if (put_lregion_here(lev, x,y,nlx,nly,nhx,nhy,rtype,oneshot,dest_lvl))
		return;

    impossible("Couldn't place lregion type %d!", rtype);
}